

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O2

PAL_ERROR __thiscall
CorUnix::CSynchWaitController::RegisterWaitingThread
          (CSynchWaitController *this,WaitType wtWaitType,DWORD dwIndex,bool fAlertable)

{
  LONG *pLVar1;
  ObjectDomain OVar2;
  CSynchData *this_00;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  CPalSynchronizationManager *this_01;
  LONG LVar6;
  PAL_ERROR PVar7;
  int iVar8;
  CPalThread *pCVar9;
  ThreadWaitInfo *ptwiWaitInfo;
  CPalThread *pCVar10;
  uint *puVar11;
  SHMPTR shmptr;
  _WaitingThreadsListNode *pwtlnNewNode;
  SynchDataGenrPtr SVar12;
  CProcProcessLocalData *pProcLocalData;
  ulong uVar13;
  
  this_01 = CPalSynchronizationManager::s_pObjSynchMgr;
  OVar2 = (this->super_CSynchControllerBase).m_odObjectDomain;
  pCVar9 = InternalGetCurrentThread();
  pCVar10 = (this->super_CSynchControllerBase).m_pthrOwner;
  if (pCVar9 != pCVar10) {
    fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x115);
    fprintf(_stderr,"Expression: InternalGetCurrentThread() == m_pthrOwner\n");
    pCVar10 = (this->super_CSynchControllerBase).m_pthrOwner;
  }
  ptwiWaitInfo = CPalSynchronizationManager::GetThreadWaitInfo(pCVar10);
  pCVar10 = (this->super_CSynchControllerBase).m_pthrOwner;
  if (ptwiWaitInfo->pthrOwner != pCVar10) {
    fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x11a);
    fprintf(_stderr,"Expression: ptwiWaitInfo->pthrOwner == m_pthrOwner\n");
    pCVar10 = (this->super_CSynchControllerBase).m_pthrOwner;
  }
  puVar11 = (uint *)SHMPtrToPtr((pCVar10->synchronizationInfo).m_shridWaitAwakened);
  pCVar10 = (this->super_CSynchControllerBase).m_pthrOwner;
  if (OVar2 == SharedObject) {
    shmptr = CSHRSynchCache<CorUnix::_WaitingThreadsListNode>::Get
                       (&this_01->m_cacheSHRWTListNodes,pCVar10);
    pwtlnNewNode = (_WaitingThreadsListNode *)SHMPtrToPtr(shmptr);
  }
  else {
    pwtlnNewNode = CSynchCache<CorUnix::_WaitingThreadsListNode>::Get
                             (&this_01->m_cacheWTListNodes,pCVar10);
    shmptr = 0;
  }
  if (pwtlnNewNode == (_WaitingThreadsListNode *)0x0) {
    if (shmptr != 0 && OVar2 == SharedObject) {
      fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
              ,0x12d);
      fprintf(_stderr,"Bad Shared Memory ptr %p\n",shmptr);
      goto LAB_0033767c;
    }
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_003379e1;
    PVar7 = 8;
  }
  else {
    if (ptwiWaitInfo->lObjCount < 0x40) {
      if (ptwiWaitInfo->lObjCount == 0) {
        ptwiWaitInfo->wtWaitType = wtWaitType;
        ptwiWaitInfo->wdWaitDomain = (this->super_CSynchControllerBase).m_wdWaitDomain;
      }
      else {
        if (ptwiWaitInfo->wtWaitType != wtWaitType) {
          fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
                  ,0x147);
          fprintf(_stderr,
                  "Expression: wtWaitType == ptwiWaitInfo->wtWaitType, Description: Conflicting wait types in wait registration\n"
                 );
        }
        if ((this->super_CSynchControllerBase).m_wdWaitDomain != ptwiWaitInfo->wdWaitDomain) {
          ptwiWaitInfo->wdWaitDomain = MixedWait;
        }
      }
      pwtlnNewNode->shridSHRThis = 0;
      uVar3 = (uint)(wtWaitType == MultipleObjectsWaitAll) * 2;
      pwtlnNewNode->ptwiWaitInfo = ptwiWaitInfo;
      pwtlnNewNode->dwObjIndex = dwIndex;
      pwtlnNewNode->dwProcessId = gPID;
      pCVar10 = (this->super_CSynchControllerBase).m_pthrOwner;
      pwtlnNewNode->dwThreadId = (DWORD)pCVar10->m_threadId;
      pwtlnNewNode->dwFlags = uVar3;
      pwtlnNewNode->shridWaitingState = (pCVar10->synchronizationInfo).m_shridWaitAwakened;
      if (OVar2 == SharedObject) {
        pwtlnNewNode->dwFlags = uVar3 | 1;
        pwtlnNewNode->shridSHRThis = shmptr;
        SVar12 = (SynchDataGenrPtr)((this->super_CSynchControllerBase).m_psdSynchData)->m_shridThis;
      }
      else {
        SVar12 = (SynchDataGenrPtr)(this->super_CSynchControllerBase).m_psdSynchData;
      }
      pwtlnNewNode->ptrOwnerObjSynchData = SVar12;
      LOCK();
      pLVar1 = &((this->super_CSynchControllerBase).m_psdSynchData)->m_lRefCount;
      *pLVar1 = *pLVar1 + 1;
      UNLOCK();
      iVar8 = ptwiWaitInfo->lObjCount;
      ptwiWaitInfo->rgpWTLNodes[iVar8] = pwtlnNewNode;
      if (((this->super_CSynchControllerBase).m_psdSynchData)->m_otiObjectTypeId == otiProcess) {
        pProcLocalData = GetProcessLocalData(this);
        if (pProcLocalData != (CProcProcessLocalData *)0x0) {
          PVar7 = CPalSynchronizationManager::RegisterProcessForMonitoring
                            (this_01,(this->super_CSynchControllerBase).m_pthrOwner,
                             (this->super_CSynchControllerBase).m_psdSynchData,pProcLocalData);
          if (PVar7 != 0) {
            bVar4 = true;
            bVar5 = false;
            goto LAB_00337713;
          }
          iVar8 = ptwiWaitInfo->lObjCount;
          goto LAB_0033790b;
        }
        fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
                ,0x172);
        fprintf(_stderr,"Process synch data pointer is missing\n");
LAB_003379d3:
        bVar5 = false;
        PVar7 = 0x54f;
      }
      else {
LAB_0033790b:
        if (iVar8 != 0) {
LAB_0033790f:
          this_00 = (this->super_CSynchControllerBase).m_psdSynchData;
          if (OVar2 == SharedObject) {
            CSynchData::SharedWaiterEnqueue(this_00,shmptr);
            ptwiWaitInfo->lSharedObjCount = ptwiWaitInfo->lSharedObjCount + 1;
          }
          else {
            CSynchData::WaiterEnqueue(this_00,pwtlnNewNode);
          }
          ptwiWaitInfo->lObjCount = ptwiWaitInfo->lObjCount + 1;
          return 0;
        }
        if (PAL_InitializeChakraCoreCalled == false) {
LAB_003379e1:
          abort();
        }
        uVar13 = 0;
        LOCK();
        if (*puVar11 == 0) {
          *puVar11 = fAlertable + 1;
        }
        else {
          uVar13 = (ulong)*puVar11;
        }
        UNLOCK();
        if ((int)uVar13 == 0) goto LAB_0033790f;
        if ((int)uVar13 != 3) {
          fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
                  ,0x19a);
          fprintf(_stderr,"Unexpected thread wait state %d\n",uVar13);
          goto LAB_003379d3;
        }
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_003379e1;
        PVar7 = 0xffffffff;
        bVar5 = true;
      }
      bVar4 = true;
      goto LAB_00337713;
    }
    fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x13a);
    fprintf(_stderr,"Too many objects");
LAB_0033767c:
    PVar7 = 0x54f;
  }
  bVar5 = false;
  bVar4 = false;
LAB_00337713:
  CPalSynchronizationManager::UnRegisterWait
            (this_01,(this->super_CSynchControllerBase).m_pthrOwner,ptwiWaitInfo,
             OVar2 == SharedObject);
  if (bVar4) {
    CSynchData::Release((this->super_CSynchControllerBase).m_psdSynchData,
                        (this->super_CSynchControllerBase).m_pthrOwner);
  }
  if (shmptr == 0 || OVar2 != SharedObject) {
    if (pwtlnNewNode != (_WaitingThreadsListNode *)0x0) {
      CSynchCache<CorUnix::_WaitingThreadsListNode>::Add
                (&this_01->m_cacheWTListNodes,(this->super_CSynchControllerBase).m_pthrOwner,
                 pwtlnNewNode);
    }
  }
  else {
    CSHRSynchCache<CorUnix::_WaitingThreadsListNode>::Add
              (&this_01->m_cacheSHRWTListNodes,(this->super_CSynchControllerBase).m_pthrOwner,shmptr
              );
  }
  if (bVar5) {
    CPalSynchronizationManager::ResetSharedSynchLock((this->super_CSynchControllerBase).m_pthrOwner)
    ;
    LVar6 = CPalSynchronizationManager::ResetLocalSynchLock
                      ((this->super_CSynchControllerBase).m_pthrOwner);
    if (LVar6 < 1) {
      fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
              ,0x1cd);
      fprintf(_stderr,"Expression: 0 < lLocalSynchLockCount\n");
    }
    CPalSynchronizationManager::ThreadPrepareForShutdown();
  }
  return PVar7;
}

Assistant:

PAL_ERROR CSynchWaitController::RegisterWaitingThread(
        WaitType wtWaitType,
        DWORD dwIndex,
        bool fAlertable)
    {
        VALIDATEOBJECT(m_psdSynchData);
        
        PAL_ERROR palErr = NO_ERROR;
        WaitingThreadsListNode * pwtlnNewNode = NULL;
        SharedID shridNewNode = NULLSharedID;
        ThreadWaitInfo * ptwiWaitInfo; 
        DWORD * pdwWaitState;
        bool fSharedObject = (SharedObject == m_odObjectDomain);
        bool fEarlyDeath = false;
        bool fSynchDataRefd = false;
        CPalSynchronizationManager * pSynchManager = 
            CPalSynchronizationManager::GetInstance();

        _ASSERTE(InternalGetCurrentThread() == m_pthrOwner);
        
        ptwiWaitInfo = CPalSynchronizationManager::GetThreadWaitInfo(
            m_pthrOwner);

        _ASSERTE(ptwiWaitInfo->pthrOwner == m_pthrOwner);
        
        pdwWaitState = SharedIDToTypePointer(DWORD,
                m_pthrOwner->synchronizationInfo.m_shridWaitAwakened);

        if (fSharedObject)
        {
            shridNewNode = pSynchManager->CacheGetSharedWTListNode(m_pthrOwner);
            pwtlnNewNode = SharedIDToTypePointer(WaitingThreadsListNode, shridNewNode);
        }
        else
        {
            pwtlnNewNode = pSynchManager->CacheGetLocalWTListNode(m_pthrOwner);
        }
        
        if (!pwtlnNewNode)
        {
            if (fSharedObject && (NULLSharedID != shridNewNode))
            {
                ASSERT("Bad Shared Memory ptr %p\n", shridNewNode);
                palErr = ERROR_INTERNAL_ERROR;
            }        
            else
            {
                ERROR("Out of memory\n");
                palErr = ERROR_NOT_ENOUGH_MEMORY;
            }
            goto RWT_exit;        
        }

        if (ptwiWaitInfo->lObjCount >= MAXIMUM_WAIT_OBJECTS)
        {
            ASSERT("Too many objects");
            palErr = ERROR_INTERNAL_ERROR; 
            goto RWT_exit;
        }       

        if (0 == ptwiWaitInfo->lObjCount)
        {
            ptwiWaitInfo->wtWaitType = wtWaitType;
            ptwiWaitInfo->wdWaitDomain = m_wdWaitDomain;
        } 
        else 
        {
            _ASSERT_MSG(wtWaitType == ptwiWaitInfo->wtWaitType,
                        "Conflicting wait types in wait registration\n");
            
            if (m_wdWaitDomain != ptwiWaitInfo->wdWaitDomain)
            {
                ptwiWaitInfo->wdWaitDomain = MixedWait;
            }
        }
        
        pwtlnNewNode->shridSHRThis       = NULLSharedID;
        pwtlnNewNode->ptwiWaitInfo       = ptwiWaitInfo;
        pwtlnNewNode->dwObjIndex         = dwIndex;
        pwtlnNewNode->dwProcessId        = gPID;
        pwtlnNewNode->dwThreadId         = m_pthrOwner->GetThreadId();
        pwtlnNewNode->dwFlags            = (MultipleObjectsWaitAll == wtWaitType) ? 
                                            WTLN_FLAG_WAIT_ALL : 0;
        pwtlnNewNode->shridWaitingState  = m_pthrOwner->synchronizationInfo.m_shridWaitAwakened; 
        if (fSharedObject)
        {
            pwtlnNewNode->dwFlags                   |= WTLN_FLAG_OWNER_OBJECT_IS_SHARED;
            pwtlnNewNode->shridSHRThis               = shridNewNode;
            pwtlnNewNode->ptrOwnerObjSynchData.shrid = m_psdSynchData->GetSharedThis();
        }
        else
        {
            pwtlnNewNode->ptrOwnerObjSynchData.ptr = m_psdSynchData;
        }
        
        // AddRef the synch data (will be released in UnregisterWait)
        m_psdSynchData->AddRef();
        fSynchDataRefd = true;

        ptwiWaitInfo->rgpWTLNodes[ptwiWaitInfo->lObjCount] = pwtlnNewNode;

        if(otiProcess == m_psdSynchData->GetObjectTypeId())
        {
            CProcProcessLocalData * pProcLocalData = GetProcessLocalData();

            if (NULL == pProcLocalData)
            {
                // Process local data pointer not set in the controller.
                // This pointer is set in CSynchWaitController only when the
                // wait controller for the object is created by calling
                // GetSynchWaitControllersForObjects
                ASSERT("Process synch data pointer is missing\n");
                palErr = ERROR_INTERNAL_ERROR;
                goto RWT_exit;
            }
            
            palErr = pSynchManager->RegisterProcessForMonitoring(m_pthrOwner,
                                                                 m_psdSynchData, 
                                                                 pProcLocalData);            
            if (NO_ERROR != palErr)
            {
                goto RWT_exit;
            }
        }
        
        if (0 == ptwiWaitInfo->lObjCount)
        {
            DWORD dwWaitState;

            // Setting the thread in wait state 
            dwWaitState = (DWORD)(fAlertable ? TWS_ALERTABLE: TWS_WAITING);

            TRACE("Switching my wait state [%p] from TWS_ACTIVE to %u \n", 
                  pdwWaitState, dwWaitState);

            dwWaitState = InterlockedCompareExchange(
                (LONG *)pdwWaitState, (LONG)dwWaitState, TWS_ACTIVE);
            if ((DWORD)TWS_ACTIVE != dwWaitState)
            {
                if ((DWORD)TWS_EARLYDEATH == dwWaitState)
                {
                    // Process is terminating, this thread will soon be 
                    // suspended (by SuspendOtherThreads).
                    WARN("Thread is about to get suspended by "
                         "TerminateProcess\n");

                    fEarlyDeath = true;
                    palErr = WAIT_FAILED;
                }
                else
                {
                    ASSERT("Unexpected thread wait state %d\n", dwWaitState);
                    palErr = ERROR_INTERNAL_ERROR;
                }
                goto RWT_exit;
            }
        }

        // Add new node to queue
        if (fSharedObject)
        {
            m_psdSynchData->SharedWaiterEnqueue(shridNewNode);
            ptwiWaitInfo->lSharedObjCount += 1;
        }
        else
        {
            m_psdSynchData->WaiterEnqueue(pwtlnNewNode);
        }

        // Succeeded: update object count
        ptwiWaitInfo->lObjCount++;

    RWT_exit:
        if (palErr != NO_ERROR)
        {
            // Unregister any partial wait registration
            pSynchManager->UnRegisterWait(m_pthrOwner, ptwiWaitInfo, fSharedObject);
            
            if (fSynchDataRefd)
            {
                m_psdSynchData->Release(m_pthrOwner);
            }
            if ((fSharedObject)  && (NULLSharedID != shridNewNode))
            {
                pSynchManager->CacheAddSharedWTListNode(m_pthrOwner, shridNewNode);
            }
            else if (NULL != pwtlnNewNode)
            {
                pSynchManager->CacheAddLocalWTListNode(m_pthrOwner, pwtlnNewNode);
            }

            if (fEarlyDeath)
            {
                // Early death detected, i.e. the process is about to exit. 
                // We need to completely release the synch lock(s) before
                // going to sleep
                LONG lLocalSynchLockCount; 
                LONG lSharedSynchLockCount;
                                          
                lSharedSynchLockCount = CPalSynchronizationManager::ResetSharedSynchLock(m_pthrOwner);
                lLocalSynchLockCount = CPalSynchronizationManager::ResetLocalSynchLock(m_pthrOwner);

                _ASSERTE(0 < lLocalSynchLockCount);

                // Sleep for ever                
                CPalSynchronizationManager::ThreadPrepareForShutdown();
            }
        }
#ifdef SYNCH_STATISTICS
        else
        {
            m_psdSynchData->IncrementStatWaitCount();
            m_psdSynchData->IncrementStatContentionCount();
        }
#endif        
        return palErr;
    }